

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

void __thiscall RefTable::Finalize(RefTable *this)

{
  ulong *in_RDI;
  SQUnsignedInteger n;
  RefNode *nodes;
  ulong local_18;
  SQObjectPtr *this_00;
  
  this_00 = (SQObjectPtr *)in_RDI[2];
  for (local_18 = 0; local_18 < *in_RDI; local_18 = local_18 + 1) {
    ::SQObjectPtr::Null(this_00);
    this_00 = this_00 + 2;
  }
  return;
}

Assistant:

void RefTable::Finalize()
{
    RefNode *nodes = _nodes;
    for(SQUnsignedInteger n = 0; n < _numofslots; n++) {
        nodes->obj.Null();
        nodes++;
    }
}